

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  clock_t cVar1;
  ostream *poVar2;
  clock_t cVar3;
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  create_files(&ss);
  cVar1 = clock();
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_21e1);
  one_thread();
  poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  cVar3 = clock();
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_2204);
  poVar2 = std::ostream::_M_insert<double>((double)(uint)((int)cVar3 - (int)cVar1) / 1000.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  cVar1 = clock();
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_221a);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
  poVar2 = std::operator<<(poVar2,anon_var_dwarf_2242);
  more_pthr();
  poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  cVar3 = clock();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,10);
  std::operator<<(poVar2,anon_var_dwarf_2258);
  poVar2 = std::ostream::_M_insert<double>((double)(uint)((int)cVar3 - (int)cVar1) / 1000.0);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return 0;
}

Assistant:

int main() {
    stringstream ss;

    //генерация случайных файлов
    create_files(ss);
    //

    unsigned int time_begin = clock();
    cout << "Сумма высчитанная в одном потоке: " << one_thread() << endl;
    unsigned int time_end = clock();
    cout << "Один поток посчитал сумму чисел во всех файлах за: " << (time_end - time_begin) / 1000.0 << endl;
    time_begin = clock();
    cout << "Сумма высчитанная в " << N << " потоках: " << more_pthr() << endl;
    time_end = clock();
    cout << N << " потоков посчитали сумму чисел во всех файлах за: " << (time_end - time_begin) / 1000.0 << endl;
    return 0;
}